

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

size_t PHF::uniq<unsigned_int>(uint *k,size_t n)

{
  size_t local_30;
  long local_28;
  size_t j;
  size_t i;
  size_t n_local;
  uint *k_local;
  
  qsort(k,n,4,Uniq::cmp<unsigned_int>);
  local_28 = 0;
  for (j = 1; j < n; j = j + 1) {
    if (k[j] != k[local_28]) {
      k[local_28 + 1] = k[j];
      local_28 = local_28 + 1;
    }
  }
  if (n == 0) {
    local_30 = 0;
  }
  else {
    local_30 = local_28 + 1;
  }
  return local_30;
}

Assistant:

PHF_PUBLIC size_t PHF::uniq(key_t k[], const size_t n) {
	using namespace PHF::Uniq;
	size_t i, j;

	qsort(k, n, sizeof *k, reinterpret_cast<int(*)(const void *, const void *)>(&cmp<key_t>));

	for (i = 1, j = 0; i < n; i++) {
		if (k[i] != k[j])
			k[++j] = k[i];
	}

	return (n > 0)? j + 1 : 0;
}